

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O2

void replay_end(void)

{
  char *name;
  char **__ptr;
  long lVar1;
  long lVar2;
  
  if (loginfo.flog != (FILE *)0x0) {
    fclose((FILE *)loginfo.flog);
    loginfo.flog = (FILE *)0x0;
    lVar1 = get_tz_offset();
    if (lVar1 != replay_timezone) {
      log_timezone((int)lVar1);
    }
    for (lVar1 = 0; name = *(char **)((long)&saved_options->name + lVar1), name != (char *)0x0;
        lVar1 = lVar1 + 0x30) {
      nh_set_option(name,*(nh_optvalue *)((long)&saved_options->value + lVar1),'\0');
    }
    free_optlist(saved_options);
    saved_options = (nh_option_desc *)0x0;
    mfree(&diff_base);
    __ptr = commands;
    if (commands != (char **)0x0) {
      lVar2 = (long)cmdcount;
      for (lVar1 = 1; lVar1 < lVar2; lVar1 = lVar1 + 1) {
        free(__ptr[lVar1]);
      }
      free(__ptr);
      commands = (char **)0x0;
    }
  }
  return;
}

Assistant:

void replay_end(void)
{
    int i;
    long tz_off;

    if (!loginfo.flog)
	return;

    fclose(loginfo.flog);
    loginfo.flog = 0;

    tz_off = get_tz_offset();
    if (tz_off != replay_timezone)
	log_timezone(tz_off);

    /* restore saved options */
    for (i = 0; saved_options[i].name; i++)
	nh_set_option(saved_options[i].name, saved_options[i].value, FALSE);
    free_optlist(saved_options);
    saved_options = NULL;

    mfree(&diff_base);

    if (!commands)
	return;
    
    for (i = 1; i < cmdcount; i++)
	free(commands[i]);
    free(commands);
    commands = NULL;
}